

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O3

UnicodeString *
anon_unknown.dwarf_1b0b9b::getWithPlural
          (UnicodeString *__return_storage_ptr__,UnicodeString *strings,Form plural,
          UErrorCode *status)

{
  UnicodeString *extraout_RAX;
  UnicodeString *pUVar1;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,strings + plural);
  pUVar1 = extraout_RAX;
  if ((undefined1  [56])((undefined1  [56])__return_storage_ptr__->fUnion & (undefined1  [56])0x1)
      != (undefined1  [56])0x0) {
    pUVar1 = icu_63::UnicodeString::operator=(__return_storage_ptr__,strings + 5);
    if ((undefined1  [56])((undefined1  [56])__return_storage_ptr__->fUnion & (undefined1  [56])0x1)
        != (undefined1  [56])0x0) {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
  }
  return pUVar1;
}

Assistant:

static UnicodeString getWithPlural(
        const UnicodeString* strings,
        StandardPlural::Form plural,
        UErrorCode& status) {
    UnicodeString result = strings[plural];
    if (result.isBogus()) {
        result = strings[StandardPlural::Form::OTHER];
    }
    if (result.isBogus()) {
        // There should always be data in the "other" plural variant.
        status = U_INTERNAL_PROGRAM_ERROR;
    }
    return result;
}